

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_encoder_isac_t_impl.h
# Opt level: O2

void __thiscall
webrtc::AudioEncoderIsacT<webrtc::IsacFloat>::RecreateEncoderInstance
          (AudioEncoderIsacT<webrtc::IsacFloat> *this,Config *config)

{
  instance_type **ISAC_main_inst;
  bool bVar1;
  string *result;
  ostream *poVar2;
  int line;
  int32_t bottleneckBPS;
  int16_t local_19a;
  FatalMessage local_198;
  
  bVar1 = Config::IsOk(config);
  if (!bVar1) {
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
               ,0x9e);
    poVar2 = std::operator<<((ostream *)&local_198,"Check failed: config.IsOk()");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<(poVar2,"# ");
    rtc::FatalMessage::~FatalMessage(&local_198);
  }
  this->packet_in_progress_ = false;
  rtc::scoped_refptr<webrtc::LockedIsacBandwidthInfo>::operator=(&this->bwinfo_,&config->bwinfo);
  if (this->isac_state_ != (ISACStruct *)0x0) {
    local_198.stream_ = (ostringstream)0x0;
    local_198._1_3_ = 0;
    local_19a = WebRtcIsac_Free(this->isac_state_);
    result = rtc::CheckEQImpl<int,short>((int *)&local_198,&local_19a,"0 == T::Free(isac_state_)");
    if (result != (string *)0x0) {
      line = 0xa2;
      goto LAB_001591a0;
    }
  }
  ISAC_main_inst = &this->isac_state_;
  local_198.stream_ = (ostringstream)0x0;
  local_198._1_3_ = 0;
  local_19a = WebRtcIsac_Create(ISAC_main_inst);
  result = rtc::CheckEQImpl<int,short>((int *)&local_198,&local_19a,"0 == T::Create(&isac_state_)");
  if (result == (string *)0x0) {
    local_198.stream_ = (ostringstream)0x0;
    local_198._1_3_ = 0;
    local_19a = WebRtcIsac_EncoderInit(*ISAC_main_inst,config->adaptive_mode ^ 1);
    result = rtc::CheckEQImpl<int,short>
                       ((int *)&local_198,&local_19a,
                        "0 == T::EncoderInit(isac_state_, config.adaptive_mode ? 0 : 1)");
    if (result == (string *)0x0) {
      local_198.stream_ = (ostringstream)0x0;
      local_198._1_3_ = 0;
      local_19a = WebRtcIsac_SetEncSampRate(*ISAC_main_inst,(uint16_t)config->sample_rate_hz);
      result = rtc::CheckEQImpl<int,short>
                         ((int *)&local_198,&local_19a,
                          "0 == T::SetEncSampRate(isac_state_, config.sample_rate_hz)");
      if (result == (string *)0x0) {
        bottleneckBPS = 32000;
        if (config->bit_rate != 0) {
          bottleneckBPS = config->bit_rate;
        }
        if (config->adaptive_mode == true) {
          local_198.stream_ = (ostringstream)0x0;
          local_198._1_3_ = 0;
          local_19a = WebRtcIsac_ControlBwe
                                (*ISAC_main_inst,bottleneckBPS,config->frame_size_ms,
                                 (ushort)config->enforce_frame_size);
          result = rtc::CheckEQImpl<int,short>
                             ((int *)&local_198,&local_19a,
                              "0 == T::ControlBwe(isac_state_, bit_rate, config.frame_size_ms, config.enforce_frame_size)"
                             );
          if (result != (string *)0x0) {
            line = 0xa9;
            goto LAB_001591a0;
          }
        }
        else {
          local_198.stream_ = (ostringstream)0x0;
          local_198._1_3_ = 0;
          local_19a = WebRtcIsac_Control(*ISAC_main_inst,bottleneckBPS,config->frame_size_ms);
          result = rtc::CheckEQImpl<int,short>
                             ((int *)&local_198,&local_19a,
                              "0 == T::Control(isac_state_, bit_rate, config.frame_size_ms)");
          if (result != (string *)0x0) {
            line = 0xab;
            goto LAB_001591a0;
          }
        }
        if (config->max_payload_size_bytes != -1) {
          local_198.stream_ = (ostringstream)0x0;
          local_198._1_3_ = 0;
          local_19a = WebRtcIsac_SetMaxPayloadSize
                                (*ISAC_main_inst,(int16_t)config->max_payload_size_bytes);
          result = rtc::CheckEQImpl<int,short>
                             ((int *)&local_198,&local_19a,
                              "0 == T::SetMaxPayloadSize(isac_state_, config.max_payload_size_bytes)"
                             );
          if (result != (string *)0x0) {
            line = 0xaf;
            goto LAB_001591a0;
          }
        }
        if (config->max_bit_rate != -1) {
          local_198.stream_ = (ostringstream)0x0;
          local_198._1_3_ = 0;
          local_19a = WebRtcIsac_SetMaxRate(*ISAC_main_inst,config->max_bit_rate);
          result = rtc::CheckEQImpl<int,short>
                             ((int *)&local_198,&local_19a,
                              "0 == T::SetMaxRate(isac_state_, config.max_bit_rate)");
          if (result != (string *)0x0) {
            line = 0xb1;
            goto LAB_001591a0;
          }
        }
        local_198.stream_ = (ostringstream)0x0;
        local_198._1_3_ = 0;
        local_19a = WebRtcIsac_SetDecSampRate(*ISAC_main_inst,(uint16_t)config->sample_rate_hz);
        result = rtc::CheckEQImpl<int,short>
                           ((int *)&local_198,&local_19a,
                            "0 == T::SetDecSampRate(isac_state_, config.sample_rate_hz)");
        if (result == (string *)0x0) {
          Config::operator=(&this->config_,config);
          return;
        }
        line = 0xb7;
      }
      else {
        line = 0xa5;
      }
    }
    else {
      line = 0xa4;
    }
  }
  else {
    line = 0xa3;
  }
LAB_001591a0:
  rtc::FatalMessage::FatalMessage
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&local_198);
}

Assistant:

void AudioEncoderIsacT<T>::RecreateEncoderInstance(const Config& config) {
  RTC_CHECK(config.IsOk());
  packet_in_progress_ = false;
  bwinfo_ = config.bwinfo;
  if (isac_state_)
    RTC_CHECK_EQ(0, T::Free(isac_state_));
  RTC_CHECK_EQ(0, T::Create(&isac_state_));
  RTC_CHECK_EQ(0, T::EncoderInit(isac_state_, config.adaptive_mode ? 0 : 1));
  RTC_CHECK_EQ(0, T::SetEncSampRate(isac_state_, config.sample_rate_hz));
  const int bit_rate = config.bit_rate == 0 ? kDefaultBitRate : config.bit_rate;
  if (config.adaptive_mode) {
    RTC_CHECK_EQ(0, T::ControlBwe(isac_state_, bit_rate, config.frame_size_ms,
                                  config.enforce_frame_size));
  } else {
    RTC_CHECK_EQ(0, T::Control(isac_state_, bit_rate, config.frame_size_ms));
  }
  if (config.max_payload_size_bytes != -1)
    RTC_CHECK_EQ(
        0, T::SetMaxPayloadSize(isac_state_, config.max_payload_size_bytes));
  if (config.max_bit_rate != -1)
    RTC_CHECK_EQ(0, T::SetMaxRate(isac_state_, config.max_bit_rate));

  // Set the decoder sample rate even though we just use the encoder. This
  // doesn't appear to be necessary to produce a valid encoding, but without it
  // we get an encoding that isn't bit-for-bit identical with what a combined
  // encoder+decoder object produces.
  RTC_CHECK_EQ(0, T::SetDecSampRate(isac_state_, config.sample_rate_hz));

  config_ = config;
}